

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void disas_chk2(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  uint uVar1;
  MemOp_conflict memop;
  TCGContext_conflict2 *s_00;
  TCGContext_conflict2 *s_01;
  TCGContext_conflict2 *s_02;
  uint32_t uVar2;
  TCGv_i32 pTVar3;
  TCGTemp *pTVar4;
  TCGTemp *pTVar5;
  TCGTemp *pTVar6;
  TCGv_i32 *ppTVar7;
  TCGv_i32 arg;
  uintptr_t o_1;
  uintptr_t o;
  uint uVar8;
  uintptr_t o_2;
  TCGTemp *local_58;
  TCGTemp *local_50;
  TCGTemp *local_48;
  TCGTemp *local_40;
  
  s_00 = s->uc->tcg_ctx;
  uVar8 = insn >> 9 & 3;
  switch(uVar8) {
  case 1:
    uVar8 = 1;
    break;
  case 2:
    uVar8 = 2;
    break;
  case 3:
    goto switchD_006f6e18_caseD_3;
  }
  uVar2 = cpu_lduw_code_m68k(env,s->pc);
  s->pc = s->pc + 2;
  if ((uVar2 >> 0xb & 1) == 0) {
switchD_006f6e18_caseD_3:
    gen_exception(s,(s->base).pc_next,4);
    return;
  }
  pTVar3 = gen_lea_mode(env,s,insn >> 3 & 7,insn & 7,7);
  pTVar4 = tcg_temp_new_internal_m68k(s_00,TCG_TYPE_I32,false);
  tcg_gen_addi_i32_m68k
            (s_00,(TCGv_i32)((long)pTVar4 - (long)s_00),pTVar3,
             *(int32_t *)(&DAT_00d88508 + uVar8 * 4));
  uVar1 = ((s->base).tb)->flags;
  s_01 = s->uc->tcg_ctx;
  pTVar5 = tcg_temp_new_internal_m68k(s_01,TCG_TYPE_I32,false);
  memop = *(MemOp_conflict *)(&DAT_00d88514 + uVar8 * 4);
  tcg_gen_qemu_ld_i32_m68k
            (s_01,(TCGv_i32)((long)pTVar5 - (long)s_01),pTVar3,(ulong)((uVar1 >> 0xd & 1) == 0),
             memop);
  tcg_temp_free_internal_m68k(s_00,(TCGTemp *)(pTVar3 + (long)s_00));
  uVar1 = ((s->base).tb)->flags;
  s_02 = s->uc->tcg_ctx;
  pTVar6 = tcg_temp_new_internal_m68k(s_02,TCG_TYPE_I32,false);
  tcg_gen_qemu_ld_i32_m68k
            (s_02,(TCGv_i32)((long)pTVar6 - (long)s_02),(TCGv_i32)((long)pTVar4 - (long)s_00),
             (ulong)((uVar1 >> 0xd & 1) == 0),memop);
  tcg_temp_free_internal_m68k(s_00,pTVar4);
  pTVar4 = tcg_temp_new_internal_m68k(s_00,TCG_TYPE_I32,false);
  pTVar3 = (TCGv_i32)((long)pTVar4 - (long)s_00);
  if ((short)uVar2 < 0) {
    uVar8 = uVar2 >> 0xc & 7;
    if (((uint)s->writeback_mask >> uVar8 & 1) == 0) {
      ppTVar7 = s->uc->tcg_ctx->cpu_aregs;
    }
    else {
      ppTVar7 = s->writeback;
    }
    arg = ppTVar7[uVar8];
  }
  else {
    arg = *(TCGv_i32 *)((long)s_00->cpu_dregs + (ulong)(uVar2 >> 9 & 0x38));
    if (uVar8 != 2) {
      if (uVar8 == 1) {
        tcg_gen_ext16s_i32_m68k(s_00,pTVar3,arg);
      }
      else {
        tcg_gen_ext8s_i32_m68k(s_00,pTVar3,arg);
      }
      goto LAB_006f700f;
    }
  }
  if (arg != pTVar3) {
    tcg_gen_op2_m68k(s_00,INDEX_op_mov_i32,(TCGArg)pTVar4,(TCGArg)(arg + (long)s_00));
  }
LAB_006f700f:
  gen_flush_flags(s);
  local_58 = (TCGTemp *)(s_00->cpu_env + (long)s_00);
  pTVar5 = (TCGTemp *)((TCGv_i32)((long)pTVar5 - (long)s_01) + (long)s_00);
  pTVar4 = (TCGTemp *)((TCGv_i32)((long)pTVar6 - (long)s_02) + (long)s_00);
  local_50 = (TCGTemp *)(pTVar3 + (long)s_00);
  local_48 = pTVar5;
  local_40 = pTVar4;
  tcg_gen_callN_m68k(s_00,helper_chk2_m68k,(TCGTemp *)0x0,4,&local_58);
  tcg_temp_free_internal_m68k(s_00,(TCGTemp *)(pTVar3 + (long)s_00));
  tcg_temp_free_internal_m68k(s_00,pTVar5);
  tcg_temp_free_internal_m68k(s_00,pTVar4);
  return;
}

Assistant:

DISAS_INSN(chk2)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    uint16_t ext;
    TCGv addr1, addr2, bound1, bound2, reg;
    int opsize;

    switch ((insn >> 9) & 3) {
    case 0:
        opsize = OS_BYTE;
        break;
    case 1:
        opsize = OS_WORD;
        break;
    case 2:
        opsize = OS_LONG;
        break;
    default:
        gen_exception(s, s->base.pc_next, EXCP_ILLEGAL);
        return;
    }

    ext = read_im16(env, s);
    if ((ext & 0x0800) == 0) {
        gen_exception(s, s->base.pc_next, EXCP_ILLEGAL);
        return;
    }

    addr1 = gen_lea(env, s, insn, OS_UNSIZED);
    addr2 = tcg_temp_new(tcg_ctx);
    tcg_gen_addi_i32(tcg_ctx, addr2, addr1, opsize_bytes(opsize));

    bound1 = gen_load(s, opsize, addr1, 1, IS_USER(s));
    tcg_temp_free(tcg_ctx, addr1);
    bound2 = gen_load(s, opsize, addr2, 1, IS_USER(s));
    tcg_temp_free(tcg_ctx, addr2);

    reg = tcg_temp_new(tcg_ctx);
    if (ext & 0x8000) {
        tcg_gen_mov_i32(tcg_ctx, reg, AREG(ext, 12));
    } else {
        gen_ext(tcg_ctx, reg, DREG(ext, 12), opsize, 1);
    }

    gen_flush_flags(s);
    gen_helper_chk2(tcg_ctx, tcg_ctx->cpu_env, reg, bound1, bound2);
    tcg_temp_free(tcg_ctx, reg);
    tcg_temp_free(tcg_ctx, bound1);
    tcg_temp_free(tcg_ctx, bound2);
}